

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGenerator::GetTargetSets
          (cmGlobalGenerator *this,TargetDependSet *projectTargets,TargetDependSet *originalTargets,
          cmLocalGenerator *root,GeneratorVector *generators)

{
  cmGeneratorTarget *target;
  bool bVar1;
  cmLocalGenerator *pcVar2;
  pointer ppcVar3;
  pointer ppcVar4;
  cmGlobalGenerator *this_00;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> tgts;
  undefined1 local_58 [24];
  cmTargetDepend local_40;
  
  ppcVar3 = (generators->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  this_00 = this;
  do {
    if (ppcVar3 ==
        (generators->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
        _M_impl.super__Vector_impl_data._M_finish) {
      return;
    }
    bVar1 = IsExcluded(this_00,root,*ppcVar3);
    if (!bVar1) {
      std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
                ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)local_58,
                 &(*ppcVar3)->GeneratorTargets);
      for (ppcVar4 = (pointer)local_58._0_8_; ppcVar4 != (pointer)local_58._8_8_;
          ppcVar4 = ppcVar4 + 1) {
        target = *ppcVar4;
        bVar1 = IsRootOnlyTarget(this,target);
        if (bVar1) {
          pcVar2 = cmGeneratorTarget::GetLocalGenerator(target);
          if (pcVar2 == root) goto LAB_002f1e93;
        }
        else {
LAB_002f1e93:
          local_40.Link = false;
          local_40.Util = false;
          local_40.Target = target;
          std::
          _Rb_tree<cmTargetDepend,_cmTargetDepend,_std::_Identity<cmTargetDepend>,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
          ::_M_insert_unique<cmTargetDepend>
                    ((_Rb_tree<cmTargetDepend,_cmTargetDepend,_std::_Identity<cmTargetDepend>,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                      *)originalTargets,&local_40);
          AddTargetDepends(this,target,projectTargets);
        }
      }
      this_00 = (cmGlobalGenerator *)local_58;
      std::_Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~_Vector_base
                ((_Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)this_00)
      ;
    }
    ppcVar3 = ppcVar3 + 1;
  } while( true );
}

Assistant:

void cmGlobalGenerator::GetTargetSets(TargetDependSet& projectTargets,
                                      TargetDependSet& originalTargets,
                                      cmLocalGenerator* root,
                                      GeneratorVector const& generators)
{
  // loop over all local generators
  for (std::vector<cmLocalGenerator*>::const_iterator i = generators.begin();
       i != generators.end(); ++i) {
    // check to make sure generator is not excluded
    if (this->IsExcluded(root, *i)) {
      continue;
    }
    // Get the targets in the makefile
    std::vector<cmGeneratorTarget*> tgts = (*i)->GetGeneratorTargets();
    // loop over all the targets
    for (std::vector<cmGeneratorTarget*>::iterator l = tgts.begin();
         l != tgts.end(); ++l) {
      cmGeneratorTarget* target = *l;
      if (this->IsRootOnlyTarget(target) &&
          target->GetLocalGenerator() != root) {
        continue;
      }
      // put the target in the set of original targets
      originalTargets.insert(target);
      // Get the set of targets that depend on target
      this->AddTargetDepends(target, projectTargets);
    }
  }
}